

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapInfo.cpp
# Opt level: O0

void __thiscall Memory::HeapInfo::ScanInitialImplicitRoots(HeapInfo *this)

{
  uint local_18;
  uint local_14;
  uint i_1;
  uint i;
  HeapInfo *this_local;
  
  for (local_14 = 0; local_14 < 0x30; local_14 = local_14 + 1) {
    HeapBucketGroup<SmallAllocationBlockAttributes>::ScanInitialImplicitRoots
              (this->heapBuckets + local_14,this->recycler);
  }
  for (local_18 = 0; local_18 < 0x1d; local_18 = local_18 + 1) {
    HeapBucketGroup<MediumAllocationBlockAttributes>::ScanInitialImplicitRoots
              (this->mediumHeapBuckets + local_18,this->recycler);
  }
  LargeHeapBucket::ScanInitialImplicitRoots(&this->largeObjectBucket,this->recycler);
  HeapBlockList::
  ForEach<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>,Memory::HeapInfo::ScanInitialImplicitRoots()::__0>
            (this->newNormalHeapBlockList,(anon_class_8_1_8991fb9c)this);
  HeapBlockList::
  ForEach<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>,Memory::HeapInfo::ScanInitialImplicitRoots()::__1>
            (this->newNormalWithBarrierHeapBlockList,(anon_class_8_1_8991fb9c)this);
  HeapBlockList::
  ForEach<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>,Memory::HeapInfo::ScanInitialImplicitRoots()::__2>
            (this->newFinalizableWithBarrierHeapBlockList,(anon_class_8_1_8991fb9c)this);
  HeapBlockList::
  ForEach<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>,Memory::HeapInfo::ScanInitialImplicitRoots()::__3>
            (this->newFinalizableHeapBlockList,(anon_class_8_1_8991fb9c)this);
  HeapBlockList::
  ForEach<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>,Memory::HeapInfo::ScanInitialImplicitRoots()::__4>
            (this->newMediumNormalHeapBlockList,(anon_class_8_1_8991fb9c)this);
  HeapBlockList::
  ForEach<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>,Memory::HeapInfo::ScanInitialImplicitRoots()::__5>
            (this->newMediumNormalWithBarrierHeapBlockList,(anon_class_8_1_8991fb9c)this);
  HeapBlockList::
  ForEach<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>,Memory::HeapInfo::ScanInitialImplicitRoots()::__6>
            (this->newMediumFinalizableWithBarrierHeapBlockList,(anon_class_8_1_8991fb9c)this);
  HeapBlockList::
  ForEach<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>,Memory::HeapInfo::ScanInitialImplicitRoots()::__7>
            (this->newMediumFinalizableHeapBlockList,(anon_class_8_1_8991fb9c)this);
  return;
}

Assistant:

void
HeapInfo::ScanInitialImplicitRoots()
{
    for (uint i = 0; i < HeapConstants::BucketCount; i++)
    {
        heapBuckets[i].ScanInitialImplicitRoots(recycler);
    }
#ifdef BUCKETIZE_MEDIUM_ALLOCATIONS
    for (uint i = 0; i < HeapConstants::MediumBucketCount; i++)
    {
        mediumHeapBuckets[i].ScanInitialImplicitRoots(recycler);
    }
#endif

    largeObjectBucket.ScanInitialImplicitRoots(recycler);

#if ENABLE_CONCURRENT_GC
    // NOTE: Don't need to do newLeafHeapBlockList

    HeapBlockList::ForEach(newNormalHeapBlockList, [this](SmallNormalHeapBlock * heapBlock)
    {
        heapBlock->ScanInitialImplicitRoots(recycler);
    });

#ifdef RECYCLER_WRITE_BARRIER
    HeapBlockList::ForEach(newNormalWithBarrierHeapBlockList, [this](SmallNormalWithBarrierHeapBlock * heapBlock)
    {
        heapBlock->ScanInitialImplicitRoots(recycler);
    });

    HeapBlockList::ForEach(newFinalizableWithBarrierHeapBlockList, [this](SmallFinalizableWithBarrierHeapBlock * heapBlock)
    {
        heapBlock->ScanInitialImplicitRoots(recycler);
    });
#endif

    HeapBlockList::ForEach(newFinalizableHeapBlockList, [this](SmallNormalHeapBlock * heapBlock)
    {
        heapBlock->ScanInitialImplicitRoots(recycler);
    });

#endif

#if ENABLE_CONCURRENT_GC
    // NOTE: Don't need to do newLeafHeapBlockList

    HeapBlockList::ForEach(newMediumNormalHeapBlockList, [this](MediumNormalHeapBlock * heapBlock)
    {
        heapBlock->ScanInitialImplicitRoots(recycler);
    });

#ifdef RECYCLER_WRITE_BARRIER
    HeapBlockList::ForEach(newMediumNormalWithBarrierHeapBlockList, [this](MediumNormalWithBarrierHeapBlock * heapBlock)
    {
        heapBlock->ScanInitialImplicitRoots(recycler);
    });

    HeapBlockList::ForEach(newMediumFinalizableWithBarrierHeapBlockList, [this](MediumFinalizableWithBarrierHeapBlock * heapBlock)
    {
        heapBlock->ScanInitialImplicitRoots(recycler);
    });
#endif

    HeapBlockList::ForEach(newMediumFinalizableHeapBlockList, [this](MediumNormalHeapBlock * heapBlock)
    {
        heapBlock->ScanInitialImplicitRoots(recycler);
    });

#endif

}